

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentParser.cpp
# Opt level: O0

bool __thiscall opencollada::ArgumentParser::parseArguments(ArgumentParser *this)

{
  bool bVar1;
  size_type sVar2;
  pointer ppVar3;
  size_t sVar4;
  ulong uVar5;
  undefined8 uVar6;
  MissingArgumentException *this_00;
  reference this_01;
  string *psVar7;
  long in_RDI;
  exception *e;
  Argument *argument_3;
  iterator __end2_1;
  iterator __begin2_1;
  vector<opencollada::Argument,_std::allocator<opencollada::Argument>_> *__range2_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>
  *argument_2;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>_>
  *__range2;
  size_t index;
  size_t subArg;
  Argument *argument;
  Argument *argument_1;
  iterator it;
  size_t arg;
  iterator noSwitchArgumentIt;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>_>
  *in_stack_fffffffffffffed8;
  __normal_iterator<opencollada::Argument_*,_std::vector<opencollada::Argument,_std::allocator<opencollada::Argument>_>_>
  *in_stack_fffffffffffffee0;
  string *in_stack_fffffffffffffee8;
  string *param;
  Argument *in_stack_fffffffffffffef0;
  __normal_iterator<opencollada::Argument_*,_std::vector<opencollada::Argument,_std::allocator<opencollada::Argument>_>_>
  local_98;
  long local_90;
  reference local_88;
  _Self local_80;
  _Self local_78 [2];
  size_type local_68;
  ulong local_60;
  Argument *local_58;
  reference local_50;
  Argument *local_48;
  _Self local_40 [3];
  _Self local_28;
  ulong local_20;
  __normal_iterator<opencollada::Argument_*,_std::vector<opencollada::Argument,_std::allocator<opencollada::Argument>_>_>
  local_18 [3];
  
  local_18[0]._M_current =
       (Argument *)
       ::std::vector<opencollada::Argument,_std::allocator<opencollada::Argument>_>::begin
                 ((vector<opencollada::Argument,_std::allocator<opencollada::Argument>_> *)
                  in_stack_fffffffffffffed8);
  local_20 = 1;
  while( true ) {
    while( true ) {
      uVar5 = local_20;
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(in_RDI + 0x48));
      if (sVar2 <= uVar5) {
        local_78[0]._M_node =
             (_Base_ptr)
             ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>_>
             ::begin(in_stack_fffffffffffffed8);
        local_80._M_node =
             (_Base_ptr)
             ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>_>
             ::end(in_stack_fffffffffffffed8);
        while( true ) {
          bVar1 = ::std::operator!=(local_78,&local_80);
          if (!bVar1) {
            local_90 = in_RDI + 0x30;
            local_98._M_current =
                 (Argument *)
                 ::std::vector<opencollada::Argument,_std::allocator<opencollada::Argument>_>::begin
                           ((vector<opencollada::Argument,_std::allocator<opencollada::Argument>_> *
                            )in_stack_fffffffffffffed8);
            ::std::vector<opencollada::Argument,_std::allocator<opencollada::Argument>_>::end
                      ((vector<opencollada::Argument,_std::allocator<opencollada::Argument>_> *)
                       in_stack_fffffffffffffed8);
            while( true ) {
              bVar1 = __gnu_cxx::operator!=
                                (in_stack_fffffffffffffee0,
                                 (__normal_iterator<opencollada::Argument_*,_std::vector<opencollada::Argument,_std::allocator<opencollada::Argument>_>_>
                                  *)in_stack_fffffffffffffed8);
              if (!bVar1) {
                return true;
              }
              this_01 = __gnu_cxx::
                        __normal_iterator<opencollada::Argument_*,_std::vector<opencollada::Argument,_std::allocator<opencollada::Argument>_>_>
                        ::operator*(&local_98);
              bVar1 = Argument::isRequired(this_01);
              if ((bVar1) && (bVar1 = Argument::isSet(this_01), !bVar1)) break;
              __gnu_cxx::
              __normal_iterator<opencollada::Argument_*,_std::vector<opencollada::Argument,_std::allocator<opencollada::Argument>_>_>
              ::operator++(&local_98);
            }
            psVar7 = (string *)__cxa_allocate_exception(0x48);
            param = psVar7;
            Argument::getHint_abi_cxx11_(this_01);
            MissingArgumentException::MissingArgumentException
                      ((MissingArgumentException *)in_stack_fffffffffffffef0,param);
            __cxa_throw(psVar7,&MissingArgumentException::typeinfo,
                        MissingArgumentException::~MissingArgumentException);
          }
          local_88 = ::std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>
                     ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>
                                  *)0x17fd41);
          bVar1 = Argument::isRequired(&local_88->second);
          if ((bVar1) && (bVar1 = Argument::isSet(&local_88->second), !bVar1)) break;
          ::std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>
          ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>
                        *)in_stack_fffffffffffffee0);
        }
        this_00 = (MissingArgumentException *)__cxa_allocate_exception(0x48);
        MissingArgumentException::MissingArgumentException(this_00,in_stack_fffffffffffffee8);
        __cxa_throw(this_00,&MissingArgumentException::typeinfo,
                    MissingArgumentException::~MissingArgumentException);
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI + 0x48),local_20);
      local_28._M_node =
           (_Base_ptr)
           ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>_>
           ::find(in_stack_fffffffffffffed8,(key_type *)0x17f9b8);
      local_40[0]._M_node =
           (_Base_ptr)
           ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>_>
           ::end(in_stack_fffffffffffffed8);
      bVar1 = ::std::operator==(&local_28,local_40);
      if (bVar1) break;
      ppVar3 = ::std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>
                             *)0x17fb52);
      local_58 = &ppVar3->second;
      Argument::isSet(local_58,true);
      for (local_60 = 0; uVar5 = local_60, sVar4 = Argument::getNumParameters((Argument *)0x17fb96),
          uVar5 < sVar4; local_60 = local_60 + 1) {
        uVar5 = local_20 + local_60 + 1;
        local_68 = uVar5;
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(in_RDI + 0x48));
        if (sVar2 <= uVar5) {
          uVar6 = __cxa_allocate_exception(0x48);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(in_RDI + 0x48),local_20);
          MissingArgumentParameterException::MissingArgumentParameterException
                    ((MissingArgumentParameterException *)in_stack_fffffffffffffef0,
                     in_stack_fffffffffffffee8);
          __cxa_throw(uVar6,&MissingArgumentParameterException::typeinfo,
                      MissingArgumentParameterException::~MissingArgumentParameterException);
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(in_RDI + 0x48),local_68);
        Argument::setValue(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                           (size_t)in_stack_fffffffffffffee0);
      }
      sVar4 = Argument::getNumParameters((Argument *)0x17fcc6);
      local_20 = sVar4 + 1 + local_20;
    }
    local_48 = (Argument *)
               ::std::vector<opencollada::Argument,_std::allocator<opencollada::Argument>_>::end
                         ((vector<opencollada::Argument,_std::allocator<opencollada::Argument>_> *)
                          in_stack_fffffffffffffed8);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffee0,
                       (__normal_iterator<opencollada::Argument_*,_std::vector<opencollada::Argument,_std::allocator<opencollada::Argument>_>_>
                        *)in_stack_fffffffffffffed8);
    if (!bVar1) break;
    local_50 = __gnu_cxx::
               __normal_iterator<opencollada::Argument_*,_std::vector<opencollada::Argument,_std::allocator<opencollada::Argument>_>_>
               ::operator*(local_18);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 0x48),local_20);
    Argument::setValue(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                       (size_t)in_stack_fffffffffffffee0);
    Argument::isSet(local_50,true);
    __gnu_cxx::
    __normal_iterator<opencollada::Argument_*,_std::vector<opencollada::Argument,_std::allocator<opencollada::Argument>_>_>
    ::operator++(local_18);
    local_20 = local_20 + 1;
  }
  uVar6 = __cxa_allocate_exception(0x48);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(in_RDI + 0x48),local_20);
  UnknowArgumentException::UnknowArgumentException
            ((UnknowArgumentException *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  __cxa_throw(uVar6,&UnknowArgumentException::typeinfo,
              UnknowArgumentException::~UnknowArgumentException);
}

Assistant:

bool ArgumentParser::parseArguments()
	{
		try
		{
			auto noSwitchArgumentIt = mNoSwitchArguments.begin();
			for (size_t arg = 1; arg < mCommandLine.size();)
			{
				auto it = mArguments.find(mCommandLine[arg]);
				if (it == mArguments.end())
				{
					if (noSwitchArgumentIt != mNoSwitchArguments.end())
					{
						Argument& argument = *noSwitchArgumentIt;
						argument.setValue(mCommandLine[arg]);
						argument.isSet(true);
						++noSwitchArgumentIt;
						++arg;
						continue;
					}

                    throw UnknowArgumentException(mCommandLine[arg]);
				}

				Argument & argument = it->second;
				argument.isSet(true);
				for (size_t subArg = 0; subArg < argument.getNumParameters(); ++subArg)
				{
					size_t index = arg + subArg + 1;
					if (index >= mCommandLine.size())
					{
                        throw MissingArgumentParameterException(mCommandLine[arg]);
					}
					argument.setValue(mCommandLine[index], subArg);
				}
				arg += 1 + argument.getNumParameters();
			}

			for (const auto & argument : mArguments)
			{
				if (argument.second.isRequired() && !argument.second.isSet())
				{
                    throw MissingArgumentException(argument.first);
				}
			}

			for (const auto & argument : mNoSwitchArguments)
			{
				if (argument.isRequired() && !argument.isSet())
				{
					throw MissingArgumentException(argument.getHint());
				}
			}
		}
		catch (exception& e)
		{
			mParseError = e.what();
			return false;
		}
		return true;
	}